

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SpecparamDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SpecparamDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ImplicitTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ImplicitTypeSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *args_3,Token *args_4)

{
  Token keyword;
  SpecparamDeclarationSyntax *pSVar1;
  ImplicitTypeSyntax *in_RCX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDX;
  SpecparamDeclarationSyntax *in_RSI;
  undefined8 in_RDI;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *in_R8;
  Info *unaff_retaddr;
  Token in_stack_00000010;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pSVar1 = (SpecparamDeclarationSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  keyword.info = unaff_retaddr;
  keyword.kind = (short)in_RDI;
  keyword._2_1_ = (char)((ulong)in_RDI >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  keyword.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::SpecparamDeclarationSyntax::SpecparamDeclarationSyntax
            (in_RSI,in_RDX,keyword,in_RCX,in_R8,in_stack_00000010);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }